

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_peeling.cpp
# Opt level: O2

BasicBlock * __thiscall
spvtools::opt::LoopPeeling::CreateBlockBefore(LoopPeeling *this,BasicBlock *bb)

{
  IRContext *this_00;
  LoopDescriptor *this_01;
  Function *pFVar1;
  unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  DefUseManager *this_02;
  CFG *this_03;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar5;
  tuple<spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_> this_04;
  Loop *this_05;
  BasicBlock *this_06;
  iterator ip;
  unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> new_bb;
  undefined1 local_60 [8];
  undefined8 local_58;
  undefined8 uStack_50;
  code *local_48;
  code *local_40;
  _Head_base<0UL,_spvtools::opt::BasicBlock_*,_false> local_38;
  
  this_02 = IRContext::get_def_use_mgr(this->context_);
  this_03 = IRContext::cfg(this->context_);
  uVar3 = BasicBlock::id(bb);
  pvVar5 = CFG::preds(this_03,uVar3);
  if ((long)(pvVar5->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(pvVar5->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start != 4) {
    __assert_fail("cfg.preds(bb->id()).size() == 1 && \"More than one predecessor\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_peeling.cpp"
                  ,0x15d,"BasicBlock *spvtools::opt::LoopPeeling::CreateBlockBefore(BasicBlock *)");
  }
  this_04.
  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
        )::operator_new(0x70);
  this_00 = this->context_;
  uVar3 = IRContext::TakeNextId(this_00);
  local_58 = (__uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
              )0x0;
  uStack_50 = (pointer)0x0;
  local_48 = (code *)0x0;
  Instruction::Instruction
            ((Instruction *)
             this_04.
             super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
             .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl,this_00,
             OpLabel,0,uVar3,(OperandList *)&stack0xffffffffffffffa8);
  local_60 = (undefined1  [8])
             this_04.
             super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
             .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  MakeUnique<spvtools::opt::BasicBlock,std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>>
            ((spvtools *)&new_bb,
             (unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
              *)local_60);
  if ((_Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
       )local_60 != (Instruction *)0x0) {
    (**(code **)(*(long *)local_60 + 8))();
  }
  local_60 = (undefined1  [8])0x0;
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
             &stack0xffffffffffffffa8);
  this_05 = LoopDescriptor::operator[]((this->loop_utils_).loop_desc_,bb);
  if (this_05 != (Loop *)0x0) {
    Loop::AddBasicBlock(this_05,(BasicBlock *)
                                new_bb._M_t.
                                super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                                .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>.
                                _M_head_impl);
    this_01 = (this->loop_utils_).loop_desc_;
    uVar3 = BasicBlock::id((BasicBlock *)
                           new_bb._M_t.
                           super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                           .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl);
    LoopDescriptor::SetBasicBlockToLoop(this_01,uVar3,this_05);
  }
  IRContext::set_instr_block
            (this->context_,
             *(Instruction **)
              ((long)new_bb._M_t.
                     super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                     .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl + 8),
             (BasicBlock *)
             new_bb._M_t.
             super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
             .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl);
  analysis::DefUseManager::AnalyzeInstDefUse
            (this_02,*(Instruction **)
                      ((long)new_bb._M_t.
                             super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                             .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl
                      + 8));
  uVar3 = BasicBlock::id(bb);
  pvVar5 = CFG::preds(this_03,uVar3);
  this_06 = CFG::block(this_03,*(pvVar5->
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                _M_impl.super__Vector_impl_data._M_start);
  BasicBlock::tail((BasicBlock *)local_60);
  local_40 = std::
             _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_peeling.cpp:366:32)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_peeling.cpp:366:32)>
             ::_M_manager;
  local_58 = bb;
  uStack_50 = (pointer)&new_bb;
  Instruction::ForEachInId
            ((Instruction *)local_60,(function<void_(unsigned_int_*)> *)&stack0xffffffffffffffa8);
  if ((Instruction *)local_48 != (Instruction *)0x0) {
    (*local_48)(&stack0xffffffffffffffa8,&stack0xffffffffffffffa8,3);
  }
  uVar3 = BasicBlock::id(this_06);
  uVar4 = BasicBlock::id(bb);
  CFG::RemoveEdge(this_03,uVar3,uVar4);
  uVar3 = BasicBlock::id(this_06);
  uVar4 = BasicBlock::id((BasicBlock *)
                         new_bb._M_t.
                         super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                         .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl);
  CFG::AddEdge(this_03,uVar3,uVar4);
  BasicBlock::tail((BasicBlock *)&stack0xffffffffffffffa8);
  analysis::DefUseManager::AnalyzeInstUse(this_02,(Instruction *)local_58);
  local_40 = std::
             _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_peeling.cpp:376:22)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_peeling.cpp:376:22)>
             ::_M_manager;
  local_58 = (Instruction *)&new_bb;
  uStack_50 = this_02;
  BasicBlock::ForEachPhiInst
            (bb,(function<void_(spvtools::opt::Instruction_*)> *)&stack0xffffffffffffffa8,false);
  if ((Instruction *)local_48 != (Instruction *)0x0) {
    (*local_48)(&stack0xffffffffffffffa8,&stack0xffffffffffffffa8,3);
  }
  InstructionBuilder::InstructionBuilder
            ((InstructionBuilder *)&stack0xffffffffffffffa8,this->context_,
             (BasicBlock *)
             new_bb._M_t.
             super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
             .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl,
             kAnalysisInstrToBlockMapping|kAnalysisBegin);
  uVar3 = BasicBlock::id(bb);
  InstructionBuilder::AddBranch((InstructionBuilder *)&stack0xffffffffffffffa8,uVar3);
  CFG::RegisterBlock(this_03,(BasicBlock *)
                             new_bb._M_t.
                             super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                             .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl
                    );
  pFVar1 = (this->loop_utils_).function_;
  uVar3 = BasicBlock::id(bb);
  ip = opt::Function::FindBlock(pFVar1,uVar3);
  uVar2 = new_bb;
  pFVar1 = (this->loop_utils_).function_;
  if ((ip.container_ == &pFVar1->blocks_) &&
     (ip.iterator_._M_current._M_current ==
      (pFVar1->blocks_).
      super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    __assert_fail("it != loop_utils_.GetFunction()->end() && \"Basic block not found in the function.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_peeling.cpp"
                  ,0x185,"BasicBlock *spvtools::opt::LoopPeeling::CreateBlockBefore(BasicBlock *)");
  }
  local_38._M_head_impl =
       (BasicBlock *)
       new_bb._M_t.
       super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
       ._M_t.
       super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
       .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
  new_bb._M_t.
  super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>.
  _M_t.
  super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
  .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl =
       (__uniq_ptr_data<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>,_true,_true>
        )(__uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
          )0x0;
  opt::Function::AddBasicBlock
            (pFVar1,(unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                     *)&stack0xffffffffffffffc8,ip);
  std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>::
  ~unique_ptr((unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
               *)&stack0xffffffffffffffc8);
  std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>::
  ~unique_ptr(&new_bb);
  return (BasicBlock *)
         (__uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
          )uVar2._M_t.
           super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
           .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
}

Assistant:

BasicBlock* LoopPeeling::CreateBlockBefore(BasicBlock* bb) {
  analysis::DefUseManager* def_use_mgr = context_->get_def_use_mgr();
  CFG& cfg = *context_->cfg();
  assert(cfg.preds(bb->id()).size() == 1 && "More than one predecessor");

  // TODO(1841): Handle id overflow.
  std::unique_ptr<BasicBlock> new_bb =
      MakeUnique<BasicBlock>(std::unique_ptr<Instruction>(new Instruction(
          context_, spv::Op::OpLabel, 0, context_->TakeNextId(), {})));
  // Update the loop descriptor.
  Loop* in_loop = (*loop_utils_.GetLoopDescriptor())[bb];
  if (in_loop) {
    in_loop->AddBasicBlock(new_bb.get());
    loop_utils_.GetLoopDescriptor()->SetBasicBlockToLoop(new_bb->id(), in_loop);
  }

  context_->set_instr_block(new_bb->GetLabelInst(), new_bb.get());
  def_use_mgr->AnalyzeInstDefUse(new_bb->GetLabelInst());

  BasicBlock* bb_pred = cfg.block(cfg.preds(bb->id())[0]);
  bb_pred->tail()->ForEachInId([bb, &new_bb](uint32_t* id) {
    if (*id == bb->id()) {
      *id = new_bb->id();
    }
  });
  cfg.RemoveEdge(bb_pred->id(), bb->id());
  cfg.AddEdge(bb_pred->id(), new_bb->id());
  def_use_mgr->AnalyzeInstUse(&*bb_pred->tail());

  // Update the incoming branch.
  bb->ForEachPhiInst([&new_bb, def_use_mgr](Instruction* phi) {
    phi->SetInOperand(1, {new_bb->id()});
    def_use_mgr->AnalyzeInstUse(phi);
  });
  InstructionBuilder(
      context_, new_bb.get(),
      IRContext::kAnalysisDefUse | IRContext::kAnalysisInstrToBlockMapping)
      .AddBranch(bb->id());
  cfg.RegisterBlock(new_bb.get());

  // Add the basic block to the function.
  Function::iterator it = loop_utils_.GetFunction()->FindBlock(bb->id());
  assert(it != loop_utils_.GetFunction()->end() &&
         "Basic block not found in the function.");
  BasicBlock* ret = new_bb.get();
  loop_utils_.GetFunction()->AddBasicBlock(std::move(new_bb), it);
  return ret;
}